

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFloatStateQueryTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Functional::anon_unknown_2::BlendColorCase::test(BlendColorCase *this)

{
  long lVar1;
  float red;
  float green;
  float blue;
  float alpha;
  GLfloat a;
  GLfloat b;
  GLfloat g;
  GLfloat r;
  int i;
  int numIterations;
  int ndx;
  FixedTest fixedTests [4];
  undefined1 local_20 [8];
  Random rnd;
  BlendColorCase *this_local;
  
  rnd.m_rnd._8_8_ = this;
  de::Random::Random((Random *)local_20,0xabcdef);
  (*this->m_verifier->_vptr_StateVerifier[5])
            (0,0,0,this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x8005);
  ApiCase::expectError(&this->super_ApiCase,0);
  memcpy(&numIterations,&DAT_02bc8e90,0x40);
  for (i = 0; i < 4; i = i + 1) {
    lVar1 = (long)i;
    glu::CallLogWrapper::glBlendColor
              (&(this->super_ApiCase).super_CallLogWrapper,(GLfloat)(&numIterations)[lVar1 * 4],
               fixedTests[lVar1 + -1].a,fixedTests[lVar1].r,fixedTests[lVar1].g);
    lVar1 = (long)i;
    (*this->m_verifier->_vptr_StateVerifier[5])
              ((&numIterations)[lVar1 * 4],fixedTests[lVar1 + -1].a,fixedTests[lVar1].r,
               fixedTests[lVar1].g,this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x8005);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  for (g = 0.0; (int)g < 0x78; g = (GLfloat)((int)g + 1)) {
    red = de::Random::getFloat((Random *)local_20,0.0,1.0);
    green = de::Random::getFloat((Random *)local_20,0.0,1.0);
    blue = de::Random::getFloat((Random *)local_20,0.0,1.0);
    alpha = de::Random::getFloat((Random *)local_20,0.0,1.0);
    glu::CallLogWrapper::glBlendColor
              (&(this->super_ApiCase).super_CallLogWrapper,red,green,blue,alpha);
    (*this->m_verifier->_vptr_StateVerifier[5])
              (red,green,blue,alpha,this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x8005);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  de::Random::~Random((Random *)local_20);
  return;
}

Assistant:

void test (void)
	{
		de::Random rnd(0xabcdef);

		m_verifier->verifyFloat4Color(m_testCtx, GL_BLEND_COLOR, 0, 0, 0, 0);
		expectError(GL_NO_ERROR);

		const struct FixedTest
		{
			float r, g, b, a;
		} fixedTests[] =
		{
			{ 0.5f, 1.0f, 0.5f, 1.0f },
			{ 0.0f, 0.5f, 0.0f, 0.5f },
			{ 0.0f, 0.0f, 0.0f, 0.0f },
			{ 1.0f, 1.0f, 1.0f, 1.0f },
		};
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(fixedTests); ++ndx)
		{
			glBlendColor(fixedTests[ndx].r, fixedTests[ndx].g, fixedTests[ndx].b, fixedTests[ndx].a);
			m_verifier->verifyFloat4Color(m_testCtx, GL_BLEND_COLOR, fixedTests[ndx].r, fixedTests[ndx].g, fixedTests[ndx].b, fixedTests[ndx].a);
			expectError(GL_NO_ERROR);
		}

		const int numIterations = 120;
		for (int i = 0; i < numIterations; ++i)
		{
			const GLfloat r = rnd.getFloat(0, 1);
			const GLfloat g = rnd.getFloat(0, 1);
			const GLfloat b = rnd.getFloat(0, 1);
			const GLfloat a = rnd.getFloat(0, 1);

			glBlendColor(r, g, b, a);
			m_verifier->verifyFloat4Color(m_testCtx, GL_BLEND_COLOR, r, g, b, a);
			expectError(GL_NO_ERROR);
		}
	}